

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

char * __thiscall
Messages::AddressBook::_InternalParse(AddressBook *this,char *ptr,ParseContext *ctx)

{
  ulong uVar1;
  bool bVar2;
  Person *msg;
  ulong uVar3;
  UnknownFieldSet *pUVar4;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar2 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
      if (bVar2) {
        return local_40;
      }
      local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
      uVar3 = (ulong)local_34;
      if (uVar3 != 10) break;
      local_40 = local_40 + -1;
      do {
        local_40 = local_40 + 1;
        msg = google::protobuf::RepeatedPtrField<Messages::Person>::Add(&this->people_);
        local_40 = google::protobuf::internal::ParseContext::ParseMessage<Messages::Person>
                             (ctx,msg,local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_40 < *(char **)ctx) && (*local_40 == '\n'));
    }
    if ((uVar3 == 0) || ((local_34 & 7) == 4)) {
      *(uint *)&ctx->field_0x50 = local_34 - 1;
      return local_40;
    }
    uVar1 = *(ulong *)&this->field_0x8;
    if ((uVar1 & 1) == 0) {
      pUVar4 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         ((InternalMetadata *)&this->field_0x8);
    }
    else {
      pUVar4 = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
    }
    local_40 = (char *)google::protobuf::internal::UnknownFieldParse(uVar3,pUVar4,local_40,ctx);
  } while (local_40 != (char *)0x0);
  return (char *)0x0;
}

Assistant:

const char* AddressBook::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .Messages.Person people = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_people(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}